

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int codeEqualityTerm(Parse *pParse,WhereTerm *pTerm,WhereLevel *pLevel,int iEq,int bRev,int iTarget)

{
  byte *pbVar1;
  u8 uVar2;
  Vdbe *pVVar3;
  WhereLoop *pWVar4;
  Index *pIVar5;
  sqlite3 *db;
  ExprList *pEVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ExprList_item *pEVar10;
  int iVar11;
  int iVar12;
  Expr *pEVar13;
  InLoop *pIVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  Expr *pEVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  undefined1 auVar23 [16];
  int iVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int iVar42;
  int iVar45;
  undefined1 auVar43 [16];
  int iVar46;
  undefined1 auVar44 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar49 [16];
  int iTab;
  ExprList *local_a0;
  int *local_98;
  ExprList *local_90;
  byte local_80;
  int local_6c;
  ExprList_item *local_68;
  Expr *local_60;
  WhereTerm *local_58;
  WhereLevel *local_50;
  Vdbe *local_48;
  ExprList *local_40;
  ExprList *local_38;
  
  pEVar19 = pTerm->pExpr;
  uVar2 = pEVar19->op;
  if (uVar2 != '5') {
    pVVar3 = pParse->pVdbe;
    if (uVar2 == '2') {
      sqlite3VdbeAddOp3(pVVar3,0x49,0,iTarget,0);
      goto LAB_00189903;
    }
    if (uVar2 != '-') {
      pWVar4 = pLevel->pWLoop;
      if ((((pWVar4->wsFlags & 0x400) == 0) &&
          (pIVar5 = (pWVar4->u).btree.pIndex, pIVar5 != (Index *)0x0)) &&
         (pIVar5->aSortOrder[iEq] != '\0')) {
        bRev = (int)(bRev == 0);
      }
      if (0 < iEq) {
        uVar17 = 0;
        do {
          if ((pWVar4->aLTerm[uVar17] != (WhereTerm *)0x0) &&
             (pWVar4->aLTerm[uVar17]->pExpr == pEVar19)) goto LAB_00189903;
          uVar17 = uVar17 + 1;
        } while ((uint)iEq != uVar17);
      }
      iVar22 = 0;
      if (iEq < (int)(uint)pWVar4->nLTerm) {
        uVar17 = (ulong)iEq;
        iVar22 = 0;
        do {
          iVar22 = iVar22 + (uint)(pWVar4->aLTerm[uVar17]->pExpr == pEVar19);
          uVar17 = uVar17 + 1;
        } while (pWVar4->nLTerm != uVar17);
      }
      local_6c = 0;
      local_58 = pTerm;
      local_50 = pLevel;
      local_48 = pVVar3;
      if (((pEVar19->flags & 0x800) == 0) || (((pEVar19->x).pSelect)->pEList->nExpr == 1)) {
        local_98 = (int *)0x0;
        iVar11 = sqlite3FindInIndex(pParse,pEVar19,4,(int *)0x0,(int *)0x0,&local_6c);
        iVar16 = local_6c;
      }
      else {
        db = pParse->db;
        pEVar13 = exprDup(db,pEVar19,0,(u8 **)0x0);
        iVar11 = 5;
        if (db->mallocFailed == '\0') {
          pEVar6 = ((pEVar13->x).pSelect)->pEList;
          local_38 = (pEVar13->pLeft->x).pList;
          uVar17 = (ulong)pWVar4->nLTerm;
          local_60 = pEVar13;
          local_40 = pEVar6;
          if (iEq < (int)(uint)pWVar4->nLTerm) {
            local_68 = local_38->a;
            lVar20 = (long)iEq;
            local_90 = (ExprList *)0x0;
            local_a0 = (ExprList *)0x0;
            do {
              if (pWVar4->aLTerm[lVar20]->pExpr == pEVar19) {
                lVar21 = (long)pWVar4->aLTerm[lVar20]->iField;
                pEVar13 = pEVar6->a[lVar21 + -1].pExpr;
                pLevel = local_50;
                if (pEVar13 != (Expr *)0x0) {
                  local_90 = sqlite3ExprListAppend((Parse *)pParse->db,local_90,pEVar13);
                  pEVar10 = local_68;
                  pEVar6->a[lVar21 + -1].pExpr = (Expr *)0x0;
                  local_a0 = sqlite3ExprListAppend
                                       ((Parse *)pParse->db,local_a0,local_68[lVar21 + -1].pExpr);
                  pEVar10[lVar21 + -1].pExpr = (Expr *)0x0;
                  uVar17 = (ulong)pWVar4->nLTerm;
                  pLevel = local_50;
                }
              }
              lVar20 = lVar20 + 1;
            } while (lVar20 < (long)uVar17);
          }
          else {
            local_a0 = (ExprList *)0x0;
            local_90 = (ExprList *)0x0;
          }
          if (local_40 != (ExprList *)0x0) {
            exprListDeleteNN(db,local_40);
          }
          pEVar13 = local_60;
          if (local_38 != (ExprList *)0x0) {
            exprListDeleteNN(db,local_38);
          }
          (pEVar13->pLeft->x).pList = local_a0;
          ((pEVar13->x).pSelect)->pEList = local_90;
          if ((local_a0 != (ExprList *)0x0) && (local_a0->nExpr == 1)) {
            pEVar19 = local_a0->a[0].pExpr;
            local_a0->a[0].pExpr = (Expr *)0x0;
            if (pEVar13->pLeft != (Expr *)0x0) {
              sqlite3ExprDeleteNN(db,pEVar13->pLeft);
            }
            pEVar13->pLeft = pEVar19;
          }
          auVar9 = _DAT_001d4f80;
          pEVar6 = ((pEVar13->x).pSelect)->pOrderBy;
          if (pEVar6 != (ExprList *)0x0) {
            iVar16 = pEVar6->nExpr;
            if (0 < (long)iVar16) {
              lVar20 = (long)iVar16 + -1;
              auVar23._8_4_ = (int)lVar20;
              auVar23._0_8_ = lVar20;
              auVar23._12_4_ = (int)((ulong)lVar20 >> 0x20);
              lVar20 = 0;
              auVar23 = auVar23 ^ _DAT_001d4f80;
              auVar25 = _DAT_001df0e0;
              auVar26 = _DAT_001df0f0;
              auVar27 = _DAT_001df100;
              auVar28 = _DAT_001df110;
              do {
                auVar29 = auVar28 ^ auVar9;
                iVar11 = auVar23._0_4_;
                iVar42 = -(uint)(iVar11 < auVar29._0_4_);
                iVar12 = auVar23._4_4_;
                auVar30._4_4_ = -(uint)(iVar12 < auVar29._4_4_);
                iVar46 = auVar23._8_4_;
                iVar45 = -(uint)(iVar46 < auVar29._8_4_);
                iVar24 = auVar23._12_4_;
                auVar30._12_4_ = -(uint)(iVar24 < auVar29._12_4_);
                auVar39._4_4_ = iVar42;
                auVar39._0_4_ = iVar42;
                auVar39._8_4_ = iVar45;
                auVar39._12_4_ = iVar45;
                auVar47 = pshuflw(in_XMM11,auVar39,0xe8);
                auVar32._4_4_ = -(uint)(auVar29._4_4_ == iVar12);
                auVar32._12_4_ = -(uint)(auVar29._12_4_ == iVar24);
                auVar32._0_4_ = auVar32._4_4_;
                auVar32._8_4_ = auVar32._12_4_;
                auVar49 = pshuflw(in_XMM12,auVar32,0xe8);
                auVar30._0_4_ = auVar30._4_4_;
                auVar30._8_4_ = auVar30._12_4_;
                auVar48 = pshuflw(auVar47,auVar30,0xe8);
                auVar29._8_4_ = 0xffffffff;
                auVar29._0_8_ = 0xffffffffffffffff;
                auVar29._12_4_ = 0xffffffff;
                auVar29 = (auVar48 | auVar49 & auVar47) ^ auVar29;
                auVar29 = packssdw(auVar29,auVar29);
                if ((auVar29 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)&pEVar6->a[0].u + lVar20) = 0;
                }
                auVar30 = auVar32 & auVar39 | auVar30;
                auVar29 = packssdw(auVar30,auVar30);
                auVar48._8_4_ = 0xffffffff;
                auVar48._0_8_ = 0xffffffffffffffff;
                auVar48._12_4_ = 0xffffffff;
                auVar29 = packssdw(auVar29 ^ auVar48,auVar29 ^ auVar48);
                if ((auVar29._0_4_ >> 0x10 & 1) != 0) {
                  *(undefined2 *)((long)&pEVar6[1].a[0].zSpan + lVar20 + 4) = 0;
                }
                auVar29 = auVar27 ^ auVar9;
                iVar42 = -(uint)(iVar11 < auVar29._0_4_);
                auVar43._4_4_ = -(uint)(iVar12 < auVar29._4_4_);
                iVar45 = -(uint)(iVar46 < auVar29._8_4_);
                auVar43._12_4_ = -(uint)(iVar24 < auVar29._12_4_);
                auVar31._4_4_ = iVar42;
                auVar31._0_4_ = iVar42;
                auVar31._8_4_ = iVar45;
                auVar31._12_4_ = iVar45;
                auVar38._4_4_ = -(uint)(auVar29._4_4_ == iVar12);
                auVar38._12_4_ = -(uint)(auVar29._12_4_ == iVar24);
                auVar38._0_4_ = auVar38._4_4_;
                auVar38._8_4_ = auVar38._12_4_;
                auVar43._0_4_ = auVar43._4_4_;
                auVar43._8_4_ = auVar43._12_4_;
                auVar29 = auVar38 & auVar31 | auVar43;
                auVar29 = packssdw(auVar29,auVar29);
                auVar7._8_4_ = 0xffffffff;
                auVar7._0_8_ = 0xffffffffffffffff;
                auVar7._12_4_ = 0xffffffff;
                auVar29 = packssdw(auVar29 ^ auVar7,auVar29 ^ auVar7);
                if ((auVar29 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)&pEVar6[2].a[0].zName + lVar20 + 4) = 0;
                }
                auVar32 = pshufhw(auVar31,auVar31,0x84);
                auVar39 = pshufhw(auVar38,auVar38,0x84);
                auVar30 = pshufhw(auVar32,auVar43,0x84);
                auVar33._8_4_ = 0xffffffff;
                auVar33._0_8_ = 0xffffffffffffffff;
                auVar33._12_4_ = 0xffffffff;
                auVar33 = (auVar30 | auVar39 & auVar32) ^ auVar33;
                auVar32 = packssdw(auVar33,auVar33);
                if ((auVar32 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)&pEVar6[3].a[0].pExpr + lVar20 + 4) = 0;
                }
                auVar32 = auVar26 ^ auVar9;
                iVar42 = -(uint)(iVar11 < auVar32._0_4_);
                auVar35._4_4_ = -(uint)(iVar12 < auVar32._4_4_);
                iVar45 = -(uint)(iVar46 < auVar32._8_4_);
                auVar35._12_4_ = -(uint)(iVar24 < auVar32._12_4_);
                auVar40._4_4_ = iVar42;
                auVar40._0_4_ = iVar42;
                auVar40._8_4_ = iVar45;
                auVar40._12_4_ = iVar45;
                auVar29 = pshuflw(auVar29,auVar40,0xe8);
                auVar34._4_4_ = -(uint)(auVar32._4_4_ == iVar12);
                auVar34._12_4_ = -(uint)(auVar32._12_4_ == iVar24);
                auVar34._0_4_ = auVar34._4_4_;
                auVar34._8_4_ = auVar34._12_4_;
                in_XMM12 = pshuflw(auVar49 & auVar47,auVar34,0xe8);
                in_XMM12 = in_XMM12 & auVar29;
                auVar35._0_4_ = auVar35._4_4_;
                auVar35._8_4_ = auVar35._12_4_;
                auVar29 = pshuflw(auVar29,auVar35,0xe8);
                auVar47._8_4_ = 0xffffffff;
                auVar47._0_8_ = 0xffffffffffffffff;
                auVar47._12_4_ = 0xffffffff;
                auVar47 = (auVar29 | in_XMM12) ^ auVar47;
                auVar29 = packssdw(auVar47,auVar47);
                if ((auVar29 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)pEVar6[4].a + lVar20 + -4) = 0;
                }
                auVar35 = auVar34 & auVar40 | auVar35;
                auVar29 = packssdw(auVar35,auVar35);
                auVar49._8_4_ = 0xffffffff;
                auVar49._0_8_ = 0xffffffffffffffff;
                auVar49._12_4_ = 0xffffffff;
                auVar29 = packssdw(auVar29 ^ auVar49,auVar29 ^ auVar49);
                if ((auVar29 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)&pEVar6[4].a[0].u + lVar20) = 0;
                }
                auVar29 = auVar25 ^ auVar9;
                iVar11 = -(uint)(iVar11 < auVar29._0_4_);
                auVar44._4_4_ = -(uint)(iVar12 < auVar29._4_4_);
                iVar46 = -(uint)(iVar46 < auVar29._8_4_);
                auVar44._12_4_ = -(uint)(iVar24 < auVar29._12_4_);
                auVar36._4_4_ = iVar11;
                auVar36._0_4_ = iVar11;
                auVar36._8_4_ = iVar46;
                auVar36._12_4_ = iVar46;
                auVar41._4_4_ = -(uint)(auVar29._4_4_ == iVar12);
                auVar41._12_4_ = -(uint)(auVar29._12_4_ == iVar24);
                auVar41._0_4_ = auVar41._4_4_;
                auVar41._8_4_ = auVar41._12_4_;
                auVar44._0_4_ = auVar44._4_4_;
                auVar44._8_4_ = auVar44._12_4_;
                auVar29 = auVar41 & auVar36 | auVar44;
                auVar29 = packssdw(auVar29,auVar29);
                auVar8._8_4_ = 0xffffffff;
                auVar8._0_8_ = 0xffffffffffffffff;
                auVar8._12_4_ = 0xffffffff;
                in_XMM11 = packssdw(auVar29 ^ auVar8,auVar29 ^ auVar8);
                if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)&pEVar6[5].a[0].zSpan + lVar20 + 4) = 0;
                }
                auVar29 = pshufhw(auVar36,auVar36,0x84);
                auVar30 = pshufhw(auVar41,auVar41,0x84);
                auVar32 = pshufhw(auVar29,auVar44,0x84);
                auVar37._8_4_ = 0xffffffff;
                auVar37._0_8_ = 0xffffffffffffffff;
                auVar37._12_4_ = 0xffffffff;
                auVar37 = (auVar32 | auVar30 & auVar29) ^ auVar37;
                auVar29 = packssdw(auVar37,auVar37);
                if ((auVar29 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)&pEVar6[6].a[0].zName + lVar20 + 4) = 0;
                }
                lVar21 = auVar28._8_8_;
                auVar28._0_8_ = auVar28._0_8_ + 8;
                auVar28._8_8_ = lVar21 + 8;
                lVar21 = auVar27._8_8_;
                auVar27._0_8_ = auVar27._0_8_ + 8;
                auVar27._8_8_ = lVar21 + 8;
                lVar21 = auVar26._8_8_;
                auVar26._0_8_ = auVar26._0_8_ + 8;
                auVar26._8_8_ = lVar21 + 8;
                lVar21 = auVar25._8_8_;
                auVar25._0_8_ = auVar25._0_8_ + 8;
                auVar25._8_8_ = lVar21 + 8;
                lVar20 = lVar20 + 0x100;
              } while ((ulong)(iVar16 + 7U >> 3) << 8 != lVar20);
            }
          }
          if (db->mallocFailed == '\0') {
            local_98 = (int *)sqlite3DbMallocZero(pParse->db,(long)iVar22 << 2);
            iVar11 = sqlite3FindInIndex(pParse,pEVar13,4,(int *)0x0,local_98,&local_6c);
            local_58->pExpr->iTable = local_6c;
            iVar16 = local_6c;
          }
          else {
            local_98 = (int *)0x0;
            iVar11 = 5;
            iVar16 = 0;
          }
        }
        else {
          local_98 = (int *)0x0;
          iVar16 = 0;
        }
        if (pEVar13 != (Expr *)0x0) {
          sqlite3ExprDeleteNN(db,pEVar13);
        }
        pEVar19 = local_58->pExpr;
      }
      uVar18 = (uint)(bRev == 0);
      if (iVar11 != 4) {
        uVar18 = bRev;
      }
      sqlite3VdbeAddOp3(local_48,(uint)(uVar18 == 0) * 4 + 0x20,iVar16,0,0);
      pbVar1 = (byte *)((long)&pWVar4->wsFlags + 1);
      *pbVar1 = *pbVar1 | 8;
      iVar12 = (pLevel->u).in.nIn;
      if (iVar12 == 0) {
        iVar12 = pParse->nLabel + -1;
        pParse->nLabel = iVar12;
        pLevel->addrNxt = iVar12;
        iVar12 = (pLevel->u).in.nIn;
      }
      (pLevel->u).in.nIn = iVar22 + iVar12;
      pIVar14 = (InLoop *)
                sqlite3DbReallocOrFree
                          (pParse->db,(pLevel->u).in.aInLoop,(long)(iVar22 + iVar12) * 0x14);
      (pLevel->u).in.aInLoop = pIVar14;
      if (pIVar14 == (InLoop *)0x0) {
        (pLevel->u).in.nIn = 0;
      }
      else {
        uVar17 = (ulong)pWVar4->nLTerm;
        if (iEq < (int)(uint)pWVar4->nLTerm) {
          pIVar14 = pIVar14 + iVar12;
          local_80 = uVar18 == 0 | 4;
          lVar21 = (long)iEq;
          local_60 = (Expr *)CONCAT44(local_60._4_4_,iTarget - iEq);
          lVar20 = 0;
          local_68 = (ExprList_item *)((ulong)local_68 & 0xffffffff00000000);
          iVar22 = iTarget;
          do {
            pVVar3 = local_48;
            if (pWVar4->aLTerm[lVar21]->pExpr == pEVar19) {
              if (iVar11 == 1) {
                iVar24 = 0x80;
                iVar12 = iVar22;
                iVar46 = 0;
              }
              else {
                if (local_98 == (int *)0x0) {
                  iVar12 = 0;
                }
                else {
                  lVar15 = (long)(int)local_68;
                  local_68 = (ExprList_item *)CONCAT44(local_68._4_4_,(int)local_68 + 1);
                  iVar12 = local_98[lVar15];
                }
                iVar24 = 0x5a;
                iVar46 = iVar22;
              }
              iVar12 = sqlite3VdbeAddOp3(local_48,iVar24,iVar16,iVar12,iVar46);
              pIVar14->addrInTop = iVar12;
              sqlite3VdbeAddOp3(pVVar3,0x32,iVar22,0,0);
              if (lVar20 == 0) {
                pIVar14->iCur = iVar16;
                pIVar14->eEndLoopOp = local_80;
                if ((iEq < 1) || (uVar18 = pWVar4->wsFlags, (uVar18 >> 10 & 1) != 0)) {
                  pIVar14->nPrefix = 0;
                }
                else {
                  pIVar14->iBase = (int)local_60;
                  pIVar14->nPrefix = iEq;
                  pWVar4->wsFlags = uVar18 | 0x40000;
                }
              }
              else {
                pIVar14->eEndLoopOp = 0xaa;
              }
              pIVar14 = pIVar14 + 1;
              uVar17 = (ulong)pWVar4->nLTerm;
            }
            lVar21 = lVar21 + 1;
            lVar20 = lVar20 + -1;
            iVar22 = iVar22 + 1;
          } while (lVar21 < (long)uVar17);
        }
      }
      pLevel = local_50;
      pTerm = local_58;
      if (local_98 != (int *)0x0) {
        sqlite3DbFreeNN(pParse->db,local_98);
        pLevel = local_50;
        pTerm = local_58;
      }
      goto LAB_00189903;
    }
  }
  iTarget = sqlite3ExprCodeTarget(pParse,pEVar19->pRight,iTarget);
LAB_00189903:
  disableTerm(pLevel,pTerm);
  return iTarget;
}

Assistant:

static int codeEqualityTerm(
  Parse *pParse,      /* The parsing context */
  WhereTerm *pTerm,   /* The term of the WHERE clause to be coded */
  WhereLevel *pLevel, /* The level of the FROM clause we are working on */
  int iEq,            /* Index of the equality term within this level */
  int bRev,           /* True for reverse-order IN operations */
  int iTarget         /* Attempt to leave results in this register */
){
  Expr *pX = pTerm->pExpr;
  Vdbe *v = pParse->pVdbe;
  int iReg;                  /* Register holding results */

  assert( pLevel->pWLoop->aLTerm[iEq]==pTerm );
  assert( iTarget>0 );
  if( pX->op==TK_EQ || pX->op==TK_IS ){
    iReg = sqlite3ExprCodeTarget(pParse, pX->pRight, iTarget);
  }else if( pX->op==TK_ISNULL ){
    iReg = iTarget;
    sqlite3VdbeAddOp2(v, OP_Null, 0, iReg);
#ifndef SQLITE_OMIT_SUBQUERY
  }else{
    int eType = IN_INDEX_NOOP;
    int iTab;
    struct InLoop *pIn;
    WhereLoop *pLoop = pLevel->pWLoop;
    int i;
    int nEq = 0;
    int *aiMap = 0;

    if( (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0
      && pLoop->u.btree.pIndex!=0
      && pLoop->u.btree.pIndex->aSortOrder[iEq]
    ){
      testcase( iEq==0 );
      testcase( bRev );
      bRev = !bRev;
    }
    assert( pX->op==TK_IN );
    iReg = iTarget;

    for(i=0; i<iEq; i++){
      if( pLoop->aLTerm[i] && pLoop->aLTerm[i]->pExpr==pX ){
        disableTerm(pLevel, pTerm);
        return iTarget;
      }
    }
    for(i=iEq;i<pLoop->nLTerm; i++){
      assert( pLoop->aLTerm[i]!=0 );
      if( pLoop->aLTerm[i]->pExpr==pX ) nEq++;
    }

    iTab = 0;
    if( (pX->flags & EP_xIsSelect)==0 || pX->x.pSelect->pEList->nExpr==1 ){
      eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, 0, &iTab);
    }else{
      sqlite3 *db = pParse->db;
      pX = removeUnindexableInClauseTerms(pParse, iEq, pLoop, pX);

      if( !db->mallocFailed ){
        aiMap = (int*)sqlite3DbMallocZero(pParse->db, sizeof(int)*nEq);
        eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, aiMap, &iTab);
        pTerm->pExpr->iTable = iTab;
      }
      sqlite3ExprDelete(db, pX);
      pX = pTerm->pExpr;
    }

    if( eType==IN_INDEX_INDEX_DESC ){
      testcase( bRev );
      bRev = !bRev;
    }
    sqlite3VdbeAddOp2(v, bRev ? OP_Last : OP_Rewind, iTab, 0);
    VdbeCoverageIf(v, bRev);
    VdbeCoverageIf(v, !bRev);
    assert( (pLoop->wsFlags & WHERE_MULTI_OR)==0 );

    pLoop->wsFlags |= WHERE_IN_ABLE;
    if( pLevel->u.in.nIn==0 ){
      pLevel->addrNxt = sqlite3VdbeMakeLabel(pParse);
    }

    i = pLevel->u.in.nIn;
    pLevel->u.in.nIn += nEq;
    pLevel->u.in.aInLoop =
       sqlite3DbReallocOrFree(pParse->db, pLevel->u.in.aInLoop,
                              sizeof(pLevel->u.in.aInLoop[0])*pLevel->u.in.nIn);
    pIn = pLevel->u.in.aInLoop;
    if( pIn ){
      int iMap = 0;               /* Index in aiMap[] */
      pIn += i;
      for(i=iEq;i<pLoop->nLTerm; i++){
        if( pLoop->aLTerm[i]->pExpr==pX ){
          int iOut = iReg + i - iEq;
          if( eType==IN_INDEX_ROWID ){
            pIn->addrInTop = sqlite3VdbeAddOp2(v, OP_Rowid, iTab, iOut);
          }else{
            int iCol = aiMap ? aiMap[iMap++] : 0;
            pIn->addrInTop = sqlite3VdbeAddOp3(v,OP_Column,iTab, iCol, iOut);
          }
          sqlite3VdbeAddOp1(v, OP_IsNull, iOut); VdbeCoverage(v);
          if( i==iEq ){
            pIn->iCur = iTab;
            pIn->eEndLoopOp = bRev ? OP_Prev : OP_Next;
            if( iEq>0 && (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0 ){
              pIn->iBase = iReg - i;
              pIn->nPrefix = i;
              pLoop->wsFlags |= WHERE_IN_EARLYOUT;
            }else{
              pIn->nPrefix = 0;
            }
          }else{
            pIn->eEndLoopOp = OP_Noop;
          }
          pIn++;
        }
      }
    }else{
      pLevel->u.in.nIn = 0;
    }
    sqlite3DbFree(pParse->db, aiMap);
#endif
  }
  disableTerm(pLevel, pTerm);
  return iReg;
}